

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void apply_imputation_results<PredictionData<double,long>,ImputedData<long,long_double>>
               (PredictionData<double,_long> *prediction_data,ImputedData<long,_long_double> *imp,
               Imputer *imputer,size_t row)

{
  longdouble lVar1;
  longdouble lVar2;
  bool bVar3;
  pointer puVar4;
  pointer plVar5;
  pointer plVar6;
  pointer pdVar7;
  double *pdVar8;
  long lVar9;
  pointer plVar10;
  pointer pvVar11;
  pointer pvVar12;
  int *piVar13;
  pointer piVar14;
  unsigned_long uVar15;
  longdouble *plVar16;
  longdouble *plVar17;
  longdouble lVar18;
  long lVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  int iVar23;
  long lVar24;
  longdouble *plVar25;
  longdouble *plVar26;
  longdouble *plVar27;
  double dVar28;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  
  bVar3 = prediction_data->is_col_major;
  sVar21 = imp->n_missing_num;
  if (bVar3 == false) {
    if (sVar21 != 0) {
      puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar5 = (imp->num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar6 = (imp->num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar20 = imputer->ncols_numeric;
      pdVar8 = prediction_data->numeric_data;
      lVar24 = 0;
      lVar18 = (longdouble)0;
      do {
        lVar9 = *(long *)((long)puVar4 + lVar24);
        lVar1 = *(longdouble *)((long)plVar6 + lVar24 * 2);
        if (lVar1 <= lVar18) {
LAB_0021333f:
          dVar28 = pdVar7[lVar9];
        }
        else {
          lVar2 = *(longdouble *)((long)plVar5 + lVar24 * 2);
          uStack_50 = (ushort)((unkuint10)lVar2 >> 0x40);
          local_58 = SUB108(lVar2,0);
          if (((unkuint10)lVar2 & 0x7fff) != 0 &&
              (0x7ffd < (ushort)((uStack_50 & 0x7fff) - 1) || -1 < local_58)) goto LAB_0021333f;
          if (((lVar2 == lVar18) && (!NAN(lVar2) && !NAN(lVar18))) && (NAN(pdVar7[lVar9])))
          goto LAB_0021333f;
          dVar28 = (double)(lVar2 / lVar1);
        }
        pdVar8[sVar20 * row + lVar9] = dVar28;
        lVar24 = lVar24 + 8;
        sVar21 = sVar21 - 1;
      } while (sVar21 != 0);
    }
  }
  else if (sVar21 != 0) {
    puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar5 = (imp->num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar6 = (imp->num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar20 = prediction_data->nrows;
    pdVar8 = prediction_data->numeric_data;
    lVar24 = 0;
    lVar18 = (longdouble)0;
    do {
      lVar9 = *(long *)((long)puVar4 + lVar24);
      lVar1 = *(longdouble *)((long)plVar6 + lVar24 * 2);
      if (lVar1 <= lVar18) {
LAB_00213276:
        dVar28 = pdVar7[lVar9];
      }
      else {
        lVar2 = *(longdouble *)((long)plVar5 + lVar24 * 2);
        uStack_60 = (ushort)((unkuint10)lVar2 >> 0x40);
        local_68 = SUB108(lVar2,0);
        if (((unkuint10)lVar2 & 0x7fff) != 0 &&
            (0x7ffd < (ushort)((uStack_60 & 0x7fff) - 1) || -1 < local_68)) goto LAB_00213276;
        if (((lVar2 == lVar18) && (!NAN(lVar2) && !NAN(lVar18))) && (NAN(pdVar7[lVar9])))
        goto LAB_00213276;
        dVar28 = (double)(lVar2 / lVar1);
      }
      pdVar8[row + lVar9 * sVar20] = dVar28;
      lVar24 = lVar24 + 8;
      sVar21 = sVar21 - 1;
    } while (sVar21 != 0);
  }
  pdVar8 = prediction_data->Xr;
  if (pdVar8 != (double *)0x0) {
    lVar24 = prediction_data->Xr_indptr[row];
    lVar9 = prediction_data->Xr_indptr[row + 1];
    if (lVar24 < lVar9) {
      plVar5 = (imp->sp_num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar6 = (imp->sp_num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar10 = (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar8[lVar24])) {
          lVar18 = plVar6[lVar19];
          if (lVar18 <= (longdouble)0) {
LAB_00213443:
            dVar28 = pdVar7[plVar10[lVar19]];
          }
          else {
            lVar1 = plVar5[lVar19];
            uStack_70 = (ushort)((unkuint10)lVar1 >> 0x40);
            local_78 = SUB108(lVar1,0);
            if (((unkuint10)lVar1 & 0x7fff) != 0 &&
                (0x7ffd < (ushort)((uStack_70 & 0x7fff) - 1) || -1 < local_78)) goto LAB_00213443;
            dVar28 = (double)(lVar1 / lVar18);
          }
          pdVar8[lVar24] = dVar28;
          lVar19 = lVar19 + 1;
        }
        lVar24 = lVar24 + 1;
      } while (lVar9 != lVar24);
    }
  }
  sVar21 = imp->n_missing_cat;
  if (bVar3 == false) {
    if (sVar21 != 0) {
      puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar24 = row * imputer->ncols_categ;
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar13 = prediction_data->categ_data;
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar20 = 0;
      do {
        uVar15 = puVar4[sVar20];
        plVar16 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        plVar17 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        plVar27 = plVar16 + 1;
        plVar25 = plVar16;
        plVar26 = plVar16;
        if (plVar27 != plVar17 && plVar16 != plVar17) {
          do {
            plVar26 = plVar27;
            if (*plVar27 <= *plVar25) {
              plVar26 = plVar25;
            }
            plVar27 = plVar27 + 1;
            plVar25 = plVar26;
          } while (plVar27 != plVar17);
        }
        iVar23 = (int)((ulong)((long)plVar26 - (long)plVar16) >> 4);
        piVar13[lVar24 + uVar15] = iVar23;
        if (iVar23 == 0) {
          iVar23 = -1;
          if ((plVar16 != plVar17) && (pvVar11 != pvVar12)) {
            if ((longdouble)0 < *plVar16) goto LAB_00213613;
            iVar23 = piVar14[uVar15];
          }
          piVar13[lVar24 + uVar15] = iVar23;
        }
LAB_00213613:
        sVar20 = sVar20 + 1;
      } while (sVar20 != sVar21);
    }
  }
  else if (sVar21 != 0) {
    puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar11 = (imp->cat_sum).
              super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (imp->cat_sum).
              super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar13 = prediction_data->categ_data;
    sVar20 = prediction_data->nrows;
    piVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar22 = 0;
    do {
      uVar15 = puVar4[sVar22];
      plVar16 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      plVar17 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      plVar27 = plVar16 + 1;
      plVar25 = plVar16;
      plVar26 = plVar16;
      if (plVar27 != plVar17 && plVar16 != plVar17) {
        do {
          plVar25 = plVar27;
          if (*plVar27 <= *plVar26) {
            plVar25 = plVar26;
          }
          plVar27 = plVar27 + 1;
          plVar26 = plVar25;
        } while (plVar27 != plVar17);
      }
      lVar24 = sVar20 * uVar15;
      iVar23 = (int)((ulong)((long)plVar25 - (long)plVar16) >> 4);
      piVar13[row + lVar24] = iVar23;
      if (iVar23 == 0) {
        iVar23 = -1;
        if ((plVar16 != plVar17) && (pvVar11 != pvVar12)) {
          if ((longdouble)0 < *plVar16) goto LAB_00213548;
          iVar23 = piVar14[uVar15];
        }
        piVar13[row + lVar24] = iVar23;
      }
LAB_00213548:
      sVar22 = sVar22 + 1;
    } while (sVar22 != sVar21);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}